

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.h
# Opt level: O1

int __thiscall google::protobuf::UnknownFieldSet::SpaceUsedExcludingSelf(UnknownFieldSet *this)

{
  size_t v1;
  Nonnull<const_char_*> pcVar1;
  
  v1 = SpaceUsedExcludingSelfLong(this);
  if ((v1 & 0xffffffff80000000) == 0) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (v1,0x7fffffff,"size <= static_cast<size_t>(INT_MAX)");
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    return (int)v1;
  }
  SpaceUsedExcludingSelf();
}

Assistant:

int SpaceUsedExcludingSelf() const {
    return internal::ToIntSize(SpaceUsedExcludingSelfLong());
  }